

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

int VP8LHashChainFill(VP8LHashChain *p,int quality,uint32_t *argb,int xsize,int ysize,int low_effort
                     )

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *__s;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint32_t uVar22;
  bool bVar23;
  
  iVar10 = ysize * xsize;
  uVar3 = 0xfff88;
  if (quality < 0x4c) {
    if (quality < 0x33) {
      uVar3 = xsize << ((0x19 < quality) * '\x02' | 4U);
    }
    else {
      uVar3 = xsize << 8;
    }
  }
  uVar7 = 0xfff88;
  if ((int)uVar3 < 0xfff88) {
    uVar7 = uVar3;
  }
  puVar1 = p->offset_length_;
  if (iVar10 < 3) {
    puVar1[(long)iVar10 + -1] = 0;
    *puVar1 = 0;
  }
  else {
    __s = WebPSafeMalloc(0x40000,4);
    if (__s == (void *)0x0) {
      return 0;
    }
    uVar20 = (uint)(quality * quality) >> 7;
    iVar4 = uVar20 + 8;
    memset(__s,0xff,0x100000);
    uVar12 = iVar10 - 2;
    uVar11 = (ulong)uVar12;
    bVar23 = *argb == argb[1];
    uVar3 = 0;
    do {
      uVar22 = argb[(long)(int)uVar3 + 1];
      if ((bVar23) && (uVar22 == argb[(long)(int)uVar3 + 2])) {
        uVar22 = argb[(int)uVar3];
        uVar21 = 1;
        if ((int)(uVar3 + 3) < iVar10) {
          uVar21 = uVar12 - uVar3;
          iVar8 = 3;
          do {
            if (argb[iVar8 + uVar3] != uVar22) {
              uVar21 = iVar8 - 2;
              break;
            }
            iVar8 = iVar8 + 1;
          } while ((uVar3 - iVar10) + iVar8 != 0);
          if (0xfff < uVar21) {
            memset(puVar1 + (int)uVar3,0xff,(ulong)(uVar21 - 0xfff) << 2);
            uVar3 = (uVar3 + uVar21) - 0xfff;
            uVar21 = 0xfff;
            goto LAB_00148290;
          }
          if (uVar21 != 0) goto LAB_00148290;
        }
        else {
LAB_00148290:
          uVar5 = uVar22 * 0x5bd1e996 + uVar21 * -0x395b586d;
          lVar15 = 0;
          do {
            puVar1[(int)uVar3 + lVar15] = *(uint32_t *)((long)__s + (ulong)(uVar5 >> 0xe) * 4);
            *(uint *)((long)__s + (ulong)(uVar5 >> 0xe) * 4) = (int)lVar15 + uVar3;
            lVar15 = lVar15 + 1;
            uVar5 = uVar5 + 0x395b586d;
          } while (uVar21 != (uint)lVar15);
          uVar3 = uVar3 + (uint)lVar15;
        }
        bVar23 = false;
      }
      else {
        bVar23 = uVar22 == argb[(long)(int)uVar3 + 2];
        uVar14 = (ulong)(argb[(int)uVar3] * 0x5bd1e996 + uVar22 * -0x395b586d >> 0xe);
        puVar1[(int)uVar3] = *(uint32_t *)((long)__s + uVar14 * 4);
        *(uint *)((long)__s + uVar14 * 4) = uVar3;
        uVar3 = uVar3 + 1;
      }
    } while ((int)uVar3 < (int)uVar12);
    puVar1[uVar3] =
         *(uint32_t *)
          ((long)__s +
          (ulong)(argb[uVar3] * 0x5bd1e996 + argb[(ulong)uVar3 + 1] * -0x395b586d >> 0xe) * 4);
    WebPSafeFree(__s);
    puVar2 = p->offset_length_;
    puVar2[iVar10 - 1U] = 0;
    *puVar2 = 0;
    if (uVar12 != 0) {
      iVar8 = uVar20 + 7;
      do {
        uVar3 = (uint)uVar11;
        iVar9 = (iVar10 - 1U) - uVar3;
        iVar6 = 0xfff;
        if (iVar9 < 0xfff) {
          iVar6 = iVar9;
        }
        uVar19 = 0;
        uVar14 = (ulong)(uVar3 - uVar7);
        if (uVar3 < uVar7) {
          uVar14 = uVar19;
        }
        if (0xff < iVar9) {
          iVar9 = 0x100;
        }
        puVar2 = argb + uVar11;
        uVar22 = puVar1[uVar11];
        iVar16 = (int)uVar14;
        if (low_effort == 0) {
          uVar20 = 0;
          uVar19 = 0;
          iVar17 = iVar4;
          uVar12 = 0;
          if (((uint)xsize <= uVar3) &&
             (uVar19 = 0, iVar17 = iVar8, puVar2[-(ulong)(uint)xsize] == *puVar2)) {
            uVar21 = (*VP8LVectorMismatch)(puVar2 + -(ulong)(uint)xsize,puVar2,iVar6);
            uVar19 = (ulong)uVar21;
            if ((int)uVar21 < 1) {
              uVar19 = 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar21) {
              uVar12 = xsize;
            }
          }
          iVar18 = (int)uVar19;
          if (puVar2[uVar19 - 1] == puVar2[uVar19]) {
            uVar20 = (*VP8LVectorMismatch)(puVar2 + -1,puVar2,iVar6);
          }
          if (iVar18 < (int)uVar20) {
            uVar19 = (ulong)uVar20;
          }
          if (iVar18 < (int)uVar20) {
            uVar12 = 1;
          }
          iVar17 = iVar17 + -1;
          if ((int)uVar19 == 0xfff) {
            uVar22 = iVar16 - 1;
          }
        }
        else {
          uVar12 = 0;
          iVar17 = iVar4;
        }
        if (iVar16 <= (int)uVar22) {
          uVar13 = puVar2[uVar19];
          do {
            iVar17 = iVar17 + -1;
            if (iVar17 == 0) break;
            if ((argb[(int)(uVar22 + (int)uVar19)] == uVar13) &&
               (uVar20 = (*VP8LVectorMismatch)(argb + (int)uVar22,puVar2,iVar6),
               (int)uVar19 < (int)uVar20)) {
              uVar12 = uVar3 - uVar22;
              if (iVar9 <= (int)uVar20) {
                uVar19 = (ulong)uVar20;
                break;
              }
              uVar13 = puVar2[uVar20];
              uVar19 = (ulong)uVar20;
            }
            uVar22 = puVar1[(int)uVar22];
          } while (iVar16 <= (int)uVar22);
        }
        puVar2 = p->offset_length_;
        uVar20 = uVar3 - 1;
        puVar2[uVar11] = (uint)uVar19 | uVar12 << 0xc;
        if (uVar12 == 0) {
          uVar14 = (ulong)uVar20;
        }
        else if ((uVar20 == 0) || (uVar20 < uVar12)) {
LAB_001485bf:
          uVar14 = (ulong)uVar20;
        }
        else {
          uVar3 = uVar3 - 2;
          do {
            uVar21 = uVar3;
            uVar14 = (ulong)(uVar21 + 1);
            if (argb[(uVar21 - uVar12) + 1] != argb[uVar14]) goto LAB_001485ca;
            iVar6 = (int)uVar19;
            if (((uVar12 != 1) && (iVar6 == 0xfff)) && (uVar21 + 0x1000 < (uint)uVar11))
            goto LAB_001485bf;
            if (iVar6 < 0xfff) {
              uVar11 = uVar14;
            }
            uVar3 = iVar6 + (uint)(iVar6 < 0xfff);
            uVar19 = (ulong)uVar3;
            puVar2[uVar14] = uVar3 | uVar12 << 0xc;
          } while ((uVar21 != 0) && (uVar20 = uVar20 - 1, uVar3 = uVar21 - 1, uVar12 <= uVar21));
          uVar14 = (ulong)uVar21;
        }
LAB_001485ca:
        uVar11 = uVar14;
      } while ((int)uVar11 != 0);
    }
  }
  return 1;
}

Assistant:

int VP8LHashChainFill(VP8LHashChain* const p, int quality,
                      const uint32_t* const argb, int xsize, int ysize,
                      int low_effort) {
  const int size = xsize * ysize;
  const int iter_max = GetMaxItersForQuality(quality);
  const uint32_t window_size = GetWindowSizeForHashChain(quality, xsize);
  int pos;
  int argb_comp;
  uint32_t base_position;
  int32_t* hash_to_first_index;
  // Temporarily use the p->offset_length_ as a hash chain.
  int32_t* chain = (int32_t*)p->offset_length_;
  assert(size > 0);
  assert(p->size_ != 0);
  assert(p->offset_length_ != NULL);

  if (size <= 2) {
    p->offset_length_[0] = p->offset_length_[size - 1] = 0;
    return 1;
  }

  hash_to_first_index =
      (int32_t*)WebPSafeMalloc(HASH_SIZE, sizeof(*hash_to_first_index));
  if (hash_to_first_index == NULL) return 0;

  // Set the int32_t array to -1.
  memset(hash_to_first_index, 0xff, HASH_SIZE * sizeof(*hash_to_first_index));
  // Fill the chain linking pixels with the same hash.
  argb_comp = (argb[0] == argb[1]);
  for (pos = 0; pos < size - 2;) {
    uint32_t hash_code;
    const int argb_comp_next = (argb[pos + 1] == argb[pos + 2]);
    if (argb_comp && argb_comp_next) {
      // Consecutive pixels with the same color will share the same hash.
      // We therefore use a different hash: the color and its repetition
      // length.
      uint32_t tmp[2];
      uint32_t len = 1;
      tmp[0] = argb[pos];
      // Figure out how far the pixels are the same.
      // The last pixel has a different 64 bit hash, as its next pixel does
      // not have the same color, so we just need to get to the last pixel equal
      // to its follower.
      while (pos + (int)len + 2 < size && argb[pos + len + 2] == argb[pos]) {
        ++len;
      }
      if (len > MAX_LENGTH) {
        // Skip the pixels that match for distance=1 and length>MAX_LENGTH
        // because they are linked to their predecessor and we automatically
        // check that in the main for loop below. Skipping means setting no
        // predecessor in the chain, hence -1.
        memset(chain + pos, 0xff, (len - MAX_LENGTH) * sizeof(*chain));
        pos += len - MAX_LENGTH;
        len = MAX_LENGTH;
      }
      // Process the rest of the hash chain.
      while (len) {
        tmp[1] = len--;
        hash_code = GetPixPairHash64(tmp);
        chain[pos] = hash_to_first_index[hash_code];
        hash_to_first_index[hash_code] = pos++;
      }
      argb_comp = 0;
    } else {
      // Just move one pixel forward.
      hash_code = GetPixPairHash64(argb + pos);
      chain[pos] = hash_to_first_index[hash_code];
      hash_to_first_index[hash_code] = pos++;
      argb_comp = argb_comp_next;
    }
  }
  // Process the penultimate pixel.
  chain[pos] = hash_to_first_index[GetPixPairHash64(argb + pos)];

  WebPSafeFree(hash_to_first_index);

  // Find the best match interval at each pixel, defined by an offset to the
  // pixel and a length. The right-most pixel cannot match anything to the right
  // (hence a best length of 0) and the left-most pixel nothing to the left
  // (hence an offset of 0).
  assert(size > 2);
  p->offset_length_[0] = p->offset_length_[size - 1] = 0;
  for (base_position = size - 2; base_position > 0;) {
    const int max_len = MaxFindCopyLength(size - 1 - base_position);
    const uint32_t* const argb_start = argb + base_position;
    int iter = iter_max;
    int best_length = 0;
    uint32_t best_distance = 0;
    uint32_t best_argb;
    const int min_pos =
        (base_position > window_size) ? base_position - window_size : 0;
    const int length_max = (max_len < 256) ? max_len : 256;
    uint32_t max_base_position;

    pos = chain[base_position];
    if (!low_effort) {
      int curr_length;
      // Heuristic: use the comparison with the above line as an initialization.
      if (base_position >= (uint32_t)xsize) {
        curr_length = FindMatchLength(argb_start - xsize, argb_start,
                                      best_length, max_len);
        if (curr_length > best_length) {
          best_length = curr_length;
          best_distance = xsize;
        }
        --iter;
      }
      // Heuristic: compare to the previous pixel.
      curr_length =
          FindMatchLength(argb_start - 1, argb_start, best_length, max_len);
      if (curr_length > best_length) {
        best_length = curr_length;
        best_distance = 1;
      }
      --iter;
      // Skip the for loop if we already have the maximum.
      if (best_length == MAX_LENGTH) pos = min_pos - 1;
    }
    best_argb = argb_start[best_length];

    for (; pos >= min_pos && --iter; pos = chain[pos]) {
      int curr_length;
      assert(base_position > (uint32_t)pos);

      if (argb[pos + best_length] != best_argb) continue;

      curr_length = VP8LVectorMismatch(argb + pos, argb_start, max_len);
      if (best_length < curr_length) {
        best_length = curr_length;
        best_distance = base_position - pos;
        best_argb = argb_start[best_length];
        // Stop if we have reached a good enough length.
        if (best_length >= length_max) break;
      }
    }
    // We have the best match but in case the two intervals continue matching
    // to the left, we have the best matches for the left-extended pixels.
    max_base_position = base_position;
    while (1) {
      assert(best_length <= MAX_LENGTH);
      assert(best_distance <= WINDOW_SIZE);
      p->offset_length_[base_position] =
          (best_distance << MAX_LENGTH_BITS) | (uint32_t)best_length;
      --base_position;
      // Stop if we don't have a match or if we are out of bounds.
      if (best_distance == 0 || base_position == 0) break;
      // Stop if we cannot extend the matching intervals to the left.
      if (base_position < best_distance ||
          argb[base_position - best_distance] != argb[base_position]) {
        break;
      }
      // Stop if we are matching at its limit because there could be a closer
      // matching interval with the same maximum length. Then again, if the
      // matching interval is as close as possible (best_distance == 1), we will
      // never find anything better so let's continue.
      if (best_length == MAX_LENGTH && best_distance != 1 &&
          base_position + MAX_LENGTH < max_base_position) {
        break;
      }
      if (best_length < MAX_LENGTH) {
        ++best_length;
        max_base_position = base_position;
      }
    }
  }
  return 1;
}